

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void __thiscall btLCP::pN_plusequals_s_times_qN(btLCP *this,btScalar *p,btScalar s,btScalar *q)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  lVar1 = (long)this->m_nC;
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->m_nN;
  if (this->m_nN < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    p[lVar1 + uVar3] = q[lVar1 + uVar3] * s + p[lVar1 + uVar3];
  }
  return;
}

Assistant:

void btLCP::pN_plusequals_s_times_qN (btScalar *p, btScalar s, btScalar *q)
{
  const int nC = m_nC;
  btScalar *ptgt = p + nC, *qsrc = q + nC;
  const int nN = m_nN;
  for (int i=0; i<nN; ++i) {
    ptgt[i] += s*qsrc[i];
  }
}